

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O0

bool TestAPI(void)

{
  LogStringBuffer *buffer_00;
  MauResult destroyResult;
  MauResult createResult;
  MauProxy proxy;
  uint16_t port;
  char *hostname;
  MauProxyConfig config;
  MauChannelConfig channel;
  LogStringBuffer buffer_1;
  LogStringBuffer buffer;
  MauChannelConfig *in_stack_fffffffffffff968;
  LogStringBuffer *in_stack_fffffffffffff970;
  MauProxy in_stack_fffffffffffff980;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_fffffffffffff9a0;
  LogStringBuffer *in_stack_fffffffffffff9a8;
  OutputWorker *in_stack_fffffffffffff9b0;
  undefined8 in_stack_fffffffffffff9b8;
  uint16_t port_00;
  Channel *pCVar1;
  char *in_stack_fffffffffffff9c0;
  undefined1 *puVar2;
  MauChannelConfig *in_stack_fffffffffffff9c8;
  MauProxyConfig *in_stack_fffffffffffff9d0;
  MauResult local_628 [2];
  duration<long,std::ratio<1l,1000l>> local_620 [12];
  int local_614;
  duration<long,std::ratio<1l,1000l>> local_610 [12];
  MauResult local_604 [4];
  undefined2 local_5f2;
  char *local_5f0;
  MauProxyConfig_t local_5e8;
  MauChannelConfig_t local_5c0;
  bool local_581;
  MauResult *local_580;
  char *local_578;
  Channel *local_570;
  MauResult *local_568;
  char *local_560;
  Channel *local_558;
  MauResult *local_550;
  char *local_548;
  undefined4 local_53c;
  Channel *local_538;
  MauResult *local_530;
  char *local_528;
  undefined4 local_51c;
  Channel *local_518;
  undefined4 local_50c;
  Channel *local_508;
  undefined4 local_4fc;
  Channel *local_4f8;
  undefined1 local_4e0 [16];
  ostream aoStack_4d0 [376];
  MauResult *local_358;
  char *local_350;
  undefined4 local_344;
  Channel *local_340;
  undefined1 local_328 [392];
  MauResult *local_1a0;
  char *local_198;
  undefined4 local_18c;
  Channel *local_188;
  MauResult *local_180;
  char *local_178;
  string *local_170;
  undefined1 *local_168;
  OutputWorker *local_160;
  MauResult *local_158;
  char *local_150;
  string *local_148;
  undefined1 *local_140;
  Channel *local_138;
  string *local_130;
  undefined1 *local_128;
  Channel *local_120;
  string *local_118;
  undefined1 *local_110;
  OutputWorker *local_108;
  MauResult *local_100;
  char *local_f8;
  undefined1 *local_f0;
  Channel *local_e8;
  MauResult *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  OutputWorker *local_c8;
  string *local_c0;
  undefined1 *local_b8;
  string *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  undefined1 *local_98;
  OutputWorker *local_90;
  char *local_88;
  undefined1 *local_80;
  Channel *local_78;
  MauResult *local_70;
  undefined1 *local_68;
  OutputWorker *local_60;
  MauResult *local_58;
  undefined1 *local_50;
  Channel *local_48;
  char *local_40;
  undefined1 *local_38;
  char *local_30;
  undefined1 *local_28;
  MauResult *local_20;
  undefined1 *local_18;
  MauResult *local_10;
  undefined1 *local_8;
  
  port_00 = (uint16_t)((ulong)in_stack_fffffffffffff9b8 >> 0x30);
  MauChannelConfig_t::MauChannelConfig_t(&local_5c0);
  local_5c0.LightSpeedMsec = 100;
  local_5c0.LossRate = 0.05;
  local_5c0.RNGSeed = 1;
  MauProxyConfig_t::MauProxyConfig_t(&local_5e8);
  local_5e8.UDPListenPort = 0x27d8;
  local_5f0 = "localhost";
  local_5f2 = 0x13c4;
  local_604[0] = mau_proxy_create(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
                                  in_stack_fffffffffffff9c0,port_00,
                                  (MauProxy *)in_stack_fffffffffffff9b0);
  if (local_604[0] == Mau_Success) {
    local_614 = 1000;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_610,&local_614);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_stack_fffffffffffff9a0);
    mau_proxy_config((MauProxy)in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    local_628[1] = 1000;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              (local_620,(int *)(local_628 + 1));
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_stack_fffffffffffff9a0);
    local_628[0] = mau_proxy_destroy(in_stack_fffffffffffff980);
    if (local_604[0] == Mau_Success) {
      local_581 = true;
    }
    else {
      local_570 = &Logger;
      local_578 = "mau_proxy_destroy failed: ";
      local_580 = local_628;
      local_518 = &Logger;
      local_51c = 4;
      local_528 = "mau_proxy_destroy failed: ";
      local_508 = &Logger;
      local_50c = 4;
      if ((int)Logger.ChannelMinLevel < 5) {
        local_340 = &Logger;
        local_344 = 4;
        local_350 = "mau_proxy_destroy failed: ";
        pCVar1 = &Logger;
        local_530 = local_580;
        local_358 = local_580;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,Trace);
        local_148 = &pCVar1->Prefix;
        local_150 = local_350;
        local_158 = local_358;
        local_140 = local_4e0;
        local_138 = pCVar1;
        local_130 = local_148;
        local_128 = local_4e0;
        local_120 = pCVar1;
        local_b0 = local_148;
        local_a8 = local_4e0;
        std::operator<<(aoStack_4d0,(string *)local_148);
        local_f0 = local_140;
        local_f8 = local_150;
        local_100 = local_158;
        local_80 = local_140;
        local_88 = local_150;
        local_38 = local_140;
        local_40 = local_150;
        local_e8 = pCVar1;
        local_78 = pCVar1;
        std::operator<<((ostream *)(local_140 + 0x10),local_150);
        local_50 = local_f0;
        local_58 = local_100;
        local_18 = local_f0;
        local_20 = local_100;
        local_48 = pCVar1;
        std::ostream::operator<<((ostream *)(local_f0 + 0x10),*local_100);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1064b9);
      }
      local_581 = false;
    }
  }
  else {
    local_558 = &Logger;
    local_560 = "mau_proxy_destroy failed: ";
    local_568 = local_604;
    local_538 = &Logger;
    local_53c = 4;
    local_548 = "mau_proxy_destroy failed: ";
    local_4f8 = &Logger;
    local_4fc = 4;
    if ((int)Logger.ChannelMinLevel < 5) {
      local_188 = &Logger;
      local_18c = 4;
      local_198 = "mau_proxy_destroy failed: ";
      pCVar1 = &Logger;
      puVar2 = local_328;
      local_550 = local_568;
      local_1a0 = local_568;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_fffffffffffff970,(char *)in_stack_fffffffffffff968,Trace);
      local_170 = (string *)
                  ((((OutputWorker *)pCVar1)->QueueLock).super___mutex_base._M_mutex.__size + 0x10);
      local_178 = local_198;
      local_180 = local_1a0;
      local_168 = puVar2;
      local_160 = (OutputWorker *)pCVar1;
      local_118 = local_170;
      local_110 = puVar2;
      local_108 = (OutputWorker *)pCVar1;
      local_c0 = local_170;
      local_b8 = puVar2;
      std::operator<<((ostream *)(puVar2 + 0x10),local_170);
      local_d0 = local_168;
      local_d8 = local_178;
      local_e0 = local_180;
      local_98 = local_168;
      local_a0 = local_178;
      local_28 = local_168;
      local_30 = local_178;
      local_c8 = (OutputWorker *)pCVar1;
      local_90 = (OutputWorker *)pCVar1;
      std::operator<<((ostream *)(local_168 + 0x10),local_178);
      local_68 = local_d0;
      local_70 = local_e0;
      local_8 = local_d0;
      local_10 = local_e0;
      local_60 = (OutputWorker *)pCVar1;
      std::ostream::operator<<((ostream *)(local_d0 + 0x10),*local_e0);
      buffer_00 = (LogStringBuffer *)logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write((OutputWorker *)pCVar1,buffer_00);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1060e7);
    }
    local_581 = false;
  }
  return local_581;
}

Assistant:

bool TestAPI()
{
    MauChannelConfig channel;
    channel.LightSpeedMsec = 100;
    channel.LossRate = 0.05f;
    channel.RNGSeed = 1;
    MauProxyConfig config;
    config.UDPListenPort = 10200;
    const char* hostname = "localhost";
    uint16_t port = 5060;
    MauProxy proxy;
    MauResult createResult = mau_proxy_create(
        &config,
        &channel,
        hostname,
        port,
        &proxy
    );
    if (MAU_FAILED(createResult))
    {
        Logger.Error("mau_proxy_destroy failed: ", createResult);
        return false;
    }

#ifdef MAU_SIMPLE_PROXY
    Logger.Debug("Press ENTER key to stop client");
    ::getchar();
    Logger.Debug("...Key press detected.  Stopping..");
#else
    std::this_thread::sleep_for(std::chrono::milliseconds(1000));

    // Example reconfigure route settings during use
    mau_proxy_config(
        proxy,
        &channel
    );

    std::this_thread::sleep_for(std::chrono::milliseconds(1000));
#endif

    MauResult destroyResult = mau_proxy_destroy(
        proxy
    );
    if (MAU_FAILED(createResult))
    {
        Logger.Error("mau_proxy_destroy failed: ", destroyResult);
        return false;
    }

    return true;
}